

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O3

Status * __thiscall
draco::PointCloudDecoder::DecodeStep1
          (Status *__return_storage_ptr__,PointCloudDecoder *this,DecoderOptions *options,
          DecoderBuffer *in_buffer,PointCloud *out_point_cloud)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  Status *_local_status;
  DracoHeader header;
  long *local_58;
  long local_50;
  long local_48 [2];
  DracoHeader local_34;
  
  this->options_ = options;
  this->buffer_ = in_buffer;
  this->point_cloud_ = out_point_cloud;
  DecodeHeader(__return_storage_ptr__,in_buffer,&local_34);
  if (__return_storage_ptr__->code_ == OK) {
    pcVar3 = (__return_storage_ptr__->error_msg_)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->error_msg_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    psVar2 = &__return_storage_ptr__->error_msg_;
    uVar4 = (*this->_vptr_PointCloudDecoder[2])(this);
    if (uVar4 == local_34.encoder_type) {
      this->version_major_ = local_34.version_major;
      this->version_minor_ = local_34.version_minor;
      if ((byte)(local_34.version_major - 3) < 0xfe) {
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Unknown major version.","");
        __return_storage_ptr__->code_ = UNKNOWN_VERSION;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)psVar2,local_58,local_50 + (long)local_58);
      }
      else if ((local_34.version_major == '\x02') &&
              ((byte)((local_34.encoder_type == 0) + 2U) < local_34.version_minor)) {
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Unknown minor version.","");
        __return_storage_ptr__->code_ = UNKNOWN_VERSION;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)psVar2,local_58,local_50 + (long)local_58);
      }
      else {
        this->buffer_->bitstream_version_ = CONCAT11(local_34.version_major,local_34.version_minor);
        if ((0x102 < CONCAT11(local_34.version_major,local_34.version_minor)) &&
           ((short)local_34.flags < 0)) {
          DecodeMetadata(__return_storage_ptr__,this);
          if (__return_storage_ptr__->code_ != OK) {
            return __return_storage_ptr__;
          }
          pcVar3 = (psVar2->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != paVar1) {
            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
          }
        }
        iVar5 = (*this->_vptr_PointCloudDecoder[3])(this);
        if ((char)iVar5 == '\0') {
          local_58 = local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"Failed to initialize the decoder.","");
          __return_storage_ptr__->code_ = DRACO_ERROR;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar2,local_58,local_50 + (long)local_58);
        }
        else {
          iVar5 = (*this->_vptr_PointCloudDecoder[5])(this);
          if ((char)iVar5 == '\0') {
            local_58 = local_48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"Failed to decode geometry data.","");
            __return_storage_ptr__->code_ = DRACO_ERROR;
            (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar2,local_58,local_50 + (long)local_58);
          }
          else {
            iVar5 = (*this->_vptr_PointCloudDecoder[6])(this);
            if ((char)iVar5 != '\0') {
              __return_storage_ptr__->code_ = OK;
              (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
              (__return_storage_ptr__->error_msg_)._M_string_length = 0;
              (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
              return __return_storage_ptr__;
            }
            local_58 = local_48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"Failed to decode point attributes.","");
            __return_storage_ptr__->code_ = DRACO_ERROR;
            (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar2,local_58,local_50 + (long)local_58);
          }
        }
      }
    }
    else {
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Using incompatible decoder for the input geometry.","");
      __return_storage_ptr__->code_ = DRACO_ERROR;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)psVar2,local_58,local_50 + (long)local_58)
      ;
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudDecoder::DecodeStep1(const DecoderOptions &options,
                                 DecoderBuffer *in_buffer,
                                 PointCloud *out_point_cloud) {
  options_ = &options;
  buffer_ = in_buffer;
  point_cloud_ = out_point_cloud;
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(DecodeHeader(buffer_, &header))
  // Sanity check that we are really using the right decoder (mostly for cases
  // where the Decode method was called manually outside of our main API.
  if (header.encoder_type != GetGeometryType()) {
    return Status(Status::DRACO_ERROR,
                  "Using incompatible decoder for the input geometry.");
  }
  // TODO(ostava): We should check the method as well, but currently decoders
  // don't expose the decoding method id.
  version_major_ = header.version_major;
  version_minor_ = header.version_minor;

  const uint8_t max_supported_major_version =
      header.encoder_type == POINT_CLOUD ? kDracoPointCloudBitstreamVersionMajor
                                         : kDracoMeshBitstreamVersionMajor;
  const uint8_t max_supported_minor_version =
      header.encoder_type == POINT_CLOUD ? kDracoPointCloudBitstreamVersionMinor
                                         : kDracoMeshBitstreamVersionMinor;

  // Check for version compatibility.
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (version_major_ < 1 || version_major_ > max_supported_major_version) {
    return Status(Status::UNKNOWN_VERSION, "Unknown major version.");
  }
  if (version_major_ == max_supported_major_version &&
      version_minor_ > max_supported_minor_version) {
    return Status(Status::UNKNOWN_VERSION, "Unknown minor version.");
  }
#else
  if (version_major_ != max_supported_major_version) {
    return Status(Status::UNKNOWN_VERSION, "Unsupported major version.");
  }
  if (version_minor_ != max_supported_minor_version) {
    return Status(Status::UNKNOWN_VERSION, "Unsupported minor version.");
  }
#endif
  buffer_->set_bitstream_version(
      DRACO_BITSTREAM_VERSION(version_major_, version_minor_));

  if (bitstream_version() >= DRACO_BITSTREAM_VERSION(1, 3) &&
      (header.flags & METADATA_FLAG_MASK)) {
    DRACO_RETURN_IF_ERROR(DecodeMetadata())
  }
  if (!InitializeDecoder()) {
    return Status(Status::DRACO_ERROR, "Failed to initialize the decoder.");
  }
  if (!DecodeGeometryData()) {
    return Status(Status::DRACO_ERROR, "Failed to decode geometry data.");
  }
  if (!DecodePointAttributesStep1()) {
    return Status(Status::DRACO_ERROR, "Failed to decode point attributes.");
  }
  return OkStatus();
}